

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack20_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar2 = *(ulong *)in;
  auVar6 = vpmovsxbd_avx(ZEXT416(0x4010100));
  auVar9._8_4_ = 0xfffff;
  auVar9._0_8_ = 0xfffff000fffff;
  auVar9._12_4_ = 0xfffff;
  uVar1 = in[4];
  *out = (uint)uVar2 & 0xfffff;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(in + 2);
  auVar5 = vpsllvd_avx2(auVar8,_DAT_001a0920);
  auVar3._8_8_ = 0xf0000000ffff0;
  auVar3._0_8_ = 0xf0000000ffff0;
  auVar5 = vpandq_avx512vl(auVar5,auVar3);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar6 = vpermi2d_avx512vl(auVar6,auVar7,auVar8);
  auVar3 = vpsrlvd_avx2(auVar6,_DAT_00194440);
  auVar6 = vpinsrd_avx(auVar9,((uint)(uVar2 >> 0x20) & 0xff) << 0xc,0);
  uVar4 = (uint)(*(ulong *)(in + 2) >> 0x20);
  auVar6 = vpunpcklqdq_avx(auVar6,auVar5);
  auVar5 = vpor_avx(auVar3,auVar6);
  auVar6 = vpand_avx(auVar3,auVar9);
  auVar6 = vpblendd_avx2(auVar5,auVar6,2);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  out[5] = uVar4 >> 4 & 0xfffff;
  out[6] = uVar4 >> 0x18 | (uVar1 & 0xfff) << 8;
  out[7] = uVar1 >> 0xc;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack20_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;

  return in;
}